

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * str_endswith_nocase(char *str,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar2 = strlen(str);
  sVar3 = strlen(suffix);
  if ((int)sVar2 < (int)sVar3) {
    pcVar4 = (char *)0x0;
  }
  else {
    iVar1 = strcasecmp(str + ((long)(int)sVar2 - (long)(int)sVar3),suffix);
    pcVar4 = (char *)0x0;
    if (iVar1 == 0) {
      pcVar4 = str + ((long)(int)sVar2 - (long)(int)sVar3);
    }
  }
  return pcVar4;
}

Assistant:

const char *str_endswith_nocase(const char *str, const char *suffix)
{
	int strl = str_length(str);
	int suffixl = str_length(suffix);
	const char *strsuffix;
	if(strl < suffixl)
	{
		return 0;
	}
	strsuffix = str + strl - suffixl;
	if(str_comp_nocase(strsuffix, suffix) == 0)
	{
		return strsuffix;
	}
	else
	{
		return 0;
	}
}